

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
kainjow::mustache::trim<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,mustache *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __tmp;
  char *pcVar5;
  
  pcVar3 = *(char **)this;
  lVar2 = *(long *)(this + 8);
  pcVar5 = pcVar3 + lVar2;
  pcVar4 = pcVar3;
  while ((lVar2 != 0 && (iVar1 = isspace((int)*pcVar3), pcVar4 = pcVar3, iVar1 != 0))) {
    pcVar3 = pcVar3 + 1;
    lVar2 = lVar2 + -1;
    pcVar4 = pcVar5;
  }
  do {
    pcVar3 = pcVar4;
    if (pcVar5 == pcVar4) break;
    iVar1 = isspace((int)pcVar5[-1]);
    pcVar3 = pcVar5;
    pcVar5 = pcVar5 + -1;
  } while (iVar1 != 0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,pcVar4,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

string_type trim(const string_type& s) {
    auto it = s.begin();
    while (it != s.end() && std::isspace(*it)) {
        it++;
    }
    auto rit = s.rbegin();
    while (rit.base() != it && std::isspace(*rit)) {
        rit++;
    }
    return {it, rit.base()};
}